

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O2

void de::cmdline::detail::TypedFieldValueTraits<std::vector<int,_std::allocator<int>_>_>::destroy
               (void *value)

{
  if (value != (void *)0x0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)value);
  }
  operator_delete(value,0x18);
  return;
}

Assistant:

static void destroy (void* value) { delete (Value*)value; }